

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
::write_number<int,false>
          (binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
           *this,int n)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  undefined1 local_4 [4];
  
  if (*this == (binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                )0x1) {
    puVar2 = local_4 + 3;
    lVar3 = 0;
    do {
      uVar1 = local_4[lVar3];
      local_4[lVar3] = *puVar2;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar3 != 2);
  }
  (**(code **)(**(long **)(this + 8) + 8))(*(long **)(this + 8),local_4,4);
  return;
}

Assistant:

void write_number(const NumberType n)
    {
        // step 1: write number to array of length NumberType
        std::array<CharType, sizeof(NumberType)> vec{};
        std::memcpy(vec.data(), &n, sizeof(NumberType));

        // step 2: write array to output (with possible reordering)
        if (is_little_endian != OutputIsLittleEndian)
        {
            // reverse byte order prior to conversion if necessary
            std::reverse(vec.begin(), vec.end());
        }

        oa->write_characters(vec.data(), sizeof(NumberType));
    }